

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int test_constRef(void)

{
  _Alloc_hider _Var1;
  int iVar2;
  T3_A *pTVar3;
  Context ctx;
  string local_80;
  Context local_60;
  
  di::Context::Context(&local_60);
  pTVar3 = di::Context::get<T3_A>(&local_60);
  T3_A::run_abi_cxx11_(&local_80,pTVar3);
  _Var1._M_p = local_80._M_dataplus._M_p;
  iVar2 = strcmp("AB",local_80._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != &local_80.field_2) {
    operator_delete(_Var1._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (iVar2 == 0) {
    iVar2 = 1;
  }
  else {
    pTVar3 = di::Context::get<T3_A>(&local_60);
    T3_A::run_abi_cxx11_(&local_80,pTVar3);
    printf("%s:%d expected \"%s\", actual: \"%s\"\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/hoditohod[P]di-light/test.cpp",
           0xf3,"AB",local_80._M_dataplus._M_p);
    iVar2 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      iVar2 = 0;
    }
  }
  di::Context::~Context(&local_60);
  return iVar2;
}

Assistant:

int test_constRef()
{
    di::Context ctx;
    TINYTEST_STR_EQUAL( "AB", ctx.get<T3_A>().run().c_str() );
    return 1;
}